

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O1

Vec_Int_t * Wla_ManCollectNodes(Wla_Man_t *pWla,int fBlack)

{
  uint Entry;
  Vec_Int_t *p;
  int *piVar1;
  Vec_Int_t *pVVar2;
  long lVar3;
  
  if (pWla->vSignals == (Vec_Int_t *)0x0) {
    __assert_fail("pWla->vSignals",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs.c"
                  ,0x537,"Vec_Int_t *Wla_ManCollectNodes(Wla_Man_t *, int)");
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar1 = (int *)malloc(400);
  p->pArray = piVar1;
  pVVar2 = pWla->vSignals;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      Entry = pVVar2->pArray[lVar3];
      if (fBlack == 0) {
        if (((int)Entry < 0) || (pWla->vUnmark->nSize <= (int)Entry)) goto LAB_008871a4;
        if (((uint)pWla->vUnmark->pArray[Entry >> 5] >> (Entry & 0x1f) & 1) != 0) goto LAB_0088715b;
      }
      else {
        if (((int)Entry < 0) || (pWla->vUnmark->nSize <= (int)Entry)) {
LAB_008871a4:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if (((uint)pWla->vUnmark->pArray[Entry >> 5] >> (Entry & 0x1f) & 1) == 0) {
LAB_0088715b:
          Vec_IntPush(p,Entry);
        }
      }
      lVar3 = lVar3 + 1;
      pVVar2 = pWla->vSignals;
    } while (lVar3 < pVVar2->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Wla_ManCollectNodes( Wla_Man_t * pWla, int fBlack )
{
    Vec_Int_t * vNodes = NULL;
    int i, Entry;

    assert( pWla->vSignals );

    vNodes = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( pWla->vSignals, Entry, i )
    {
        if ( !fBlack && Vec_BitEntry(pWla->vUnmark, Entry) )
            Vec_IntPush( vNodes, Entry );
        
        if ( fBlack && !Vec_BitEntry(pWla->vUnmark, Entry) )
            Vec_IntPush( vNodes, Entry );
    }

    return vNodes;
}